

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [64];
  uint uVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  ulong uVar12;
  float *pfVar13;
  int iVar14;
  float *pfVar15;
  float *pfVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 in_ZMM3 [64];
  
  uVar6 = a->c;
  iVar14 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar17 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    uVar22 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar22 = 0;
    }
    for (uVar12 = 0; uVar12 != uVar22; uVar12 = uVar12 + 1) {
      pvVar7 = a->data;
      pvVar8 = b->data;
      pvVar9 = c->data;
      lVar20 = a->elemsize * a->cstep * uVar12;
      lVar19 = b->elemsize * b->cstep * uVar12;
      lVar18 = c->elemsize * c->cstep * uVar12;
      lVar21 = 0;
      for (iVar17 = 0; iVar17 + 0xf < iVar14; iVar17 = iVar17 + 0x10) {
        auVar24 = *(undefined1 (*) [64])((long)pvVar8 + lVar21 + lVar19);
        auVar23 = vrcp14ps_avx512f(auVar24);
        auVar5 = *(undefined1 (*) [64])((long)pvVar7 + lVar21 + lVar20);
        in_ZMM3 = vmulps_avx512f(auVar5,auVar23);
        auVar24 = vfmsub213ps_avx512f(auVar24,in_ZMM3,auVar5);
        auVar24 = vfnmadd213ps_avx512f(auVar24,auVar23,in_ZMM3);
        *(undefined1 (*) [64])((long)pvVar9 + lVar21 + lVar18) = auVar24;
        lVar21 = lVar21 + 0x40;
      }
      for (; iVar17 + 7 < iVar14; iVar17 = iVar17 + 8) {
        auVar3 = *(undefined1 (*) [32])((long)pvVar8 + lVar21 + lVar19);
        auVar11 = vrcpps_avx(auVar3);
        auVar4 = *(undefined1 (*) [32])((long)pvVar7 + lVar21 + lVar20);
        auVar24._0_4_ = auVar4._0_4_ * auVar11._0_4_;
        auVar24._4_4_ = auVar4._4_4_ * auVar11._4_4_;
        auVar24._8_4_ = auVar4._8_4_ * auVar11._8_4_;
        auVar24._12_4_ = auVar4._12_4_ * auVar11._12_4_;
        auVar24._16_4_ = auVar4._16_4_ * auVar11._16_4_;
        auVar24._20_4_ = auVar4._20_4_ * auVar11._20_4_;
        auVar24._28_36_ = in_ZMM3._28_36_;
        auVar24._24_4_ = auVar4._24_4_ * auVar11._24_4_;
        auVar26 = auVar24._0_32_;
        in_ZMM3 = ZEXT3264(auVar26);
        auVar1 = vfmsub213ps_fma(auVar3,auVar26,auVar4);
        auVar1 = vfnmadd213ps_fma(ZEXT1632(auVar1),auVar11,auVar26);
        *(undefined1 (*) [32])((long)pvVar9 + lVar21 + lVar18) = ZEXT1632(auVar1);
        lVar21 = lVar21 + 0x20;
      }
      for (; iVar17 + 3 < iVar14; iVar17 = iVar17 + 4) {
        auVar1 = *(undefined1 (*) [16])((long)pvVar7 + lVar21 + lVar20);
        auVar2 = *(undefined1 (*) [16])((long)pvVar8 + lVar21 + lVar19);
        auVar10 = vrcpps_avx(auVar2);
        auVar25._0_4_ = auVar1._0_4_ * auVar10._0_4_;
        auVar25._4_4_ = auVar1._4_4_ * auVar10._4_4_;
        auVar25._8_4_ = auVar1._8_4_ * auVar10._8_4_;
        auVar25._12_4_ = auVar1._12_4_ * auVar10._12_4_;
        in_ZMM3 = ZEXT1664(auVar25);
        auVar1 = vfmsub213ps_fma(auVar2,auVar25,auVar1);
        auVar1 = vfnmadd213ps_fma(auVar1,auVar10,auVar25);
        *(undefined1 (*) [16])((long)pvVar9 + lVar21 + lVar18) = auVar1;
        lVar21 = lVar21 + 0x10;
      }
      pfVar13 = (float *)((long)pvVar7 + lVar20 + lVar21);
      pfVar15 = (float *)((long)pvVar8 + lVar19 + lVar21);
      pfVar16 = (float *)((long)pvVar9 + lVar18 + lVar21);
      for (; iVar17 < iVar14; iVar17 = iVar17 + 1) {
        *pfVar16 = *pfVar13 / *pfVar15;
        pfVar13 = pfVar13 + 1;
        pfVar15 = pfVar15 + 1;
        pfVar16 = pfVar16 + 1;
      }
    }
    iVar17 = 0;
  }
  return iVar17;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}